

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::PrintTopLevelDecl
          (ForwardDeclarations *this,Formatter *format,Options *options)

{
  _Base_ptr p_Var1;
  Options *in_RCX;
  string local_50;
  
  for (p_Var1 = (this->classes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->classes_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    QualifiedClassName_abi_cxx11_(&local_50,*(cpp **)(p_Var1 + 2),(Descriptor *)options,in_RCX);
    Formatter::operator()
              (format,"template<> $dllexport_decl $$1$* Arena::CreateMaybeMessage<$1$>(Arena*);\n",
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void PrintTopLevelDecl(const Formatter& format,
                         const Options& options) const {
    for (const auto& pair : classes_) {
      format(
          "template<> $dllexport_decl $"
          "$1$* Arena::CreateMaybeMessage<$1$>(Arena*);\n",
          QualifiedClassName(pair.second, options));
    }
  }